

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jkGetF0.cc
# Opt level: O0

int sptk::snack::save_windstat
              (float *rho,int order,float err,float rms,int wReuse,Windstat *windstat)

{
  int j;
  int i;
  Windstat *windstat_local;
  int wReuse_local;
  float rms_local;
  float err_local;
  int order_local;
  float *rho_local;
  int local_4;
  
  if (wReuse < 2) {
    if (wReuse == 1) {
      for (i = 0; i <= order; i = i + 1) {
        windstat->rho[i] = rho[i];
      }
      windstat->err = err;
      windstat->rms = rms;
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    for (j = 1; j < wReuse; j = j + 1) {
      for (i = 0; i <= order; i = i + 1) {
        windstat[j + -1].rho[i] = windstat[j].rho[i];
      }
      windstat[j + -1].err = windstat[j].err;
      windstat[j + -1].rms = windstat[j].rms;
    }
    for (i = 0; i <= order; i = i + 1) {
      windstat[wReuse + -1].rho[i] = rho[i];
    }
    windstat[wReuse + -1].err = err;
    windstat[wReuse + -1].rms = rms;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

save_windstat(float *rho, int order, float err, float rms, int wReuse, Windstat *windstat)
#endif
{
    int i,j;

    if(wReuse > 1){               /* push down the stack */
	for(j=1; j<wReuse; j++){
	    for(i=0;i<=order; i++) windstat[j-1].rho[i] = windstat[j].rho[i];
	    windstat[j-1].err = windstat[j].err;
	    windstat[j-1].rms = windstat[j].rms;
	}
	for(i=0;i<=order; i++) windstat[wReuse-1].rho[i] = rho[i]; /*save*/
	windstat[wReuse-1].err = (float) err;
	windstat[wReuse-1].rms = (float) rms;
	return 1;
    } else if (wReuse == 1) {
	for(i=0;i<=order; i++) windstat[0].rho[i] = rho[i];  /* save */
	windstat[0].err = (float) err;
	windstat[0].rms = (float) rms;
	return 1;
    } else 
	return 0;
}